

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int apply_remote_transport_params(quicly_conn_t *conn)

{
  ulong uVar1;
  int iVar2;
  
  uVar1 = (conn->super).remote.transport_params.max_streams_uni;
  (conn->egress).max_data.permitted = (conn->super).remote.transport_params.max_data;
  iVar2 = 0x20004;
  if (uVar1 < 0x1000000000000001) {
    iVar2 = 0;
    if (((conn->egress).max_streams.uni.count < uVar1) &&
       ((conn->egress).max_streams.uni.count = uVar1,
       (ulong)(conn->egress).max_streams.uni.blocked_sender.max_acked < uVar1)) {
      (conn->egress).max_streams.uni.blocked_sender.max_acked = uVar1;
      iVar2 = 0;
    }
  }
  if (uVar1 < 0x1000000000000001) {
    uVar1 = (conn->super).remote.transport_params.max_streams_bidi;
    iVar2 = 0x20004;
    if (((uVar1 < 0x1000000000000001) && (iVar2 = 0, (conn->egress).max_streams.bidi.count < uVar1))
       && ((conn->egress).max_streams.bidi.count = uVar1,
          (ulong)(conn->egress).max_streams.bidi.blocked_sender.max_acked < uVar1)) {
      (conn->egress).max_streams.bidi.blocked_sender.max_acked = uVar1;
    }
  }
  return iVar2;
}

Assistant:

static int apply_remote_transport_params(quicly_conn_t *conn)
{
    int ret;

    conn->egress.max_data.permitted = conn->super.remote.transport_params.max_data;
    if ((ret = update_max_streams(&conn->egress.max_streams.uni, conn->super.remote.transport_params.max_streams_uni)) != 0)
        return ret;
    if ((ret = update_max_streams(&conn->egress.max_streams.bidi, conn->super.remote.transport_params.max_streams_bidi)) != 0)
        return ret;

    return 0;
}